

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall
crnlib::crn_comp::pack_color_endpoints_etc
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_short *puVar5;
  uchar *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint32 _e_1;
  vector<unsigned_int> remapped_endpoints;
  symbol_histogram hist;
  static_huffman_data_model dm;
  symbol_codec codec;
  elemental_vector local_138;
  elemental_vector local_128;
  uint local_10c;
  vector<unsigned_char> *local_108;
  static_huffman_data_model local_100;
  symbol_codec local_c8;
  
  uVar2 = (this->m_color_endpoints).m_size;
  local_138.m_p = (void *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  if (uVar2 != 0) {
    elemental_vector::increase_capacity(&local_138,uVar2,uVar2 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_138._8_8_ & 0xffffffff) * 4 + (long)local_138.m_p),0,
           (ulong)(uVar2 - local_138.m_size) << 2);
    local_138.m_size = uVar2;
  }
  if ((this->m_color_endpoints).m_size != 0) {
    puVar4 = (this->m_color_endpoints).m_p;
    puVar5 = remapping->m_p;
    uVar9 = 0;
    do {
      uVar8 = puVar4[uVar9];
      *(uint *)((long)local_138.m_p + (ulong)puVar5[uVar9] * 4) =
           uVar8 >> 3 & 0x1f1f1f | uVar8 & 0x7000000;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->m_color_endpoints).m_size);
  }
  local_128.m_p = (void *)0x0;
  local_128.m_size = 0;
  local_128.m_capacity = 0;
  elemental_vector::increase_capacity(&local_128,0x20,false,4,(object_mover)0x0,false);
  memset((void *)((local_128._8_8_ & 0xffffffff) * 4 + (long)local_128.m_p),0,
         (ulong)(0x20 - local_128.m_size) << 2);
  local_128.m_size = 0x20;
  if (local_138.m_size != 0) {
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar7 = *(uint *)((long)local_138.m_p + uVar9 * 4);
      iVar10 = 4;
      uVar11 = uVar7;
      do {
        piVar1 = (int *)((long)local_128.m_p + (ulong)(uVar11 - uVar8 & 0x1f) * 4);
        *piVar1 = *piVar1 + 1;
        uVar8 = uVar8 >> 8;
        uVar11 = uVar11 >> 8;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      uVar9 = uVar9 + 1;
      uVar8 = uVar7;
    } while (uVar9 < (local_138._8_8_ & 0xffffffff));
  }
  static_huffman_data_model::static_huffman_data_model(&local_100);
  static_huffman_data_model::init(&local_100,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(&local_c8);
  local_108 = packed_data;
  symbol_codec::start_encoding(&local_c8,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,&local_100,false,(static_huffman_data_model *)0x0);
  if (local_138.m_size != 0) {
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar7 = *(uint *)((long)local_138.m_p + uVar9 * 4);
      iVar10 = 4;
      local_10c = uVar7;
      do {
        symbol_codec::encode(&local_c8,uVar7 - uVar8 & 0x1f,&local_100);
        uVar8 = uVar8 >> 8;
        uVar7 = uVar7 >> 8;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      uVar9 = uVar9 + 1;
      uVar8 = local_10c;
    } while (uVar9 < (local_138._8_8_ & 0xffffffff));
  }
  symbol_codec::stop_encoding(&local_c8,false);
  puVar6 = local_108->m_p;
  local_108->m_p = local_c8.m_output_buf.m_p;
  uVar2 = local_108->m_size;
  local_108->m_size = local_c8.m_output_buf.m_size;
  uVar3 = local_108->m_capacity;
  local_108->m_capacity = local_c8.m_output_buf.m_capacity;
  local_c8.m_output_buf.m_p = puVar6;
  local_c8.m_output_buf.m_size = uVar2;
  local_c8.m_output_buf.m_capacity = uVar3;
  if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_c8.m_output_syms.m_p);
  }
  if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_arith_output_buf.m_p);
  }
  if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model(&local_100);
  if (local_128.m_p != (void *)0x0) {
    crnlib_free(local_128.m_p);
  }
  if (local_138.m_p != (void *)0x0) {
    crnlib_free(local_138.m_p);
  }
  return true;
}

Assistant:

bool crn_comp::pack_color_endpoints_etc(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint32> remapped_endpoints(m_color_endpoints.size());
        for (uint i = 0; i < m_color_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = (m_color_endpoints[i] & 0x07000000) | (m_color_endpoints[i] >> 3 & 0x001F1F1F);
        }

        symbol_histogram hist(32);
        for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++)
        {
            for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
            {
                hist.inc_freq((e - _e) & 0x1F);
            }
        }
        static_huffman_data_model dm;
        dm.init(true, hist, 15);
        symbol_codec codec;
        codec.start_encoding(1024 * 1024);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++)
        {
            for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
            {
                codec.encode((e - _e) & 0x1F, dm);
            }
        }
        codec.stop_encoding(false);
        packed_data.swap(codec.get_encoding_buf());
        return true;
    }